

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

type * append_type(type *head,type *el)

{
  type_mode tVar1;
  type *ptVar2;
  anon_union_8_5_3fbb1736_for_u *paVar3;
  
  if (head != (type *)0x0) {
    tVar1 = head->mode;
    if ((tVar1 == TM_FUNC) || (tVar1 == TM_ARR)) {
      paVar3 = (anon_union_8_5_3fbb1736_for_u *)&((head->u).ptr_type)->arr_type;
    }
    else {
      if (tVar1 != TM_PTR) {
        __assert_fail("head->mode == TM_FUNC",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x1b18,"struct type *append_type(struct type *, struct type *)");
      }
      paVar3 = &head->u;
    }
    ptVar2 = append_type(paVar3->ptr_type,el);
    paVar3->ptr_type = ptVar2;
    el = head;
  }
  return el;
}

Assistant:

static struct type *append_type (struct type *head, struct type *el) {
  struct type **holder;

  if (head == NULL) return el;
  if (head->mode == TM_PTR) {
    holder = &head->u.ptr_type;
  } else if (head->mode == TM_ARR) {
    holder = &head->u.arr_type->el_type;
  } else {
    assert (head->mode == TM_FUNC);
    holder = &head->u.func_type->ret_type;
  }
  *holder = append_type (*holder, el);
  return head;
}